

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::SetViewports
          (VulkanCommandBuffer *this,uint32_t FirstViewport,uint32_t ViewportCount,
          VkViewport *pViewports)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  VkViewport *pViewports_local;
  uint32_t ViewportCount_local;
  uint32_t FirstViewport_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = pViewports;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])pViewports);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1b7);
    std::__cxx11::string::~string((string *)local_40);
  }
  (*vkCmdSetViewport)(this->m_VkCmdBuffer,FirstViewport,ViewportCount,
                      (VkViewport *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void SetViewports(uint32_t FirstViewport, uint32_t ViewportCount, const VkViewport* pViewports)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdSetViewport(m_VkCmdBuffer, FirstViewport, ViewportCount, pViewports);
    }